

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_var_to_local.cpp
# Opt level: O0

VarId optimization::global_var_to_local::get_new_id(MirFunction *f,Variable *v)

{
  undefined8 extraout_RDX;
  Displayable in_RDI;
  VarId VVar1;
  iterator end;
  VarId *id;
  undefined4 in_stack_ffffffffffffff48;
  uint32_t in_stack_ffffffffffffff4c;
  value_type *__x;
  pair<const_unsigned_int,_mir::inst::Variable> *this;
  _Base_ptr local_20 [4];
  
  this = (pair<const_unsigned_int,_mir::inst::Variable> *)in_RDI._vptr_Displayable;
  local_20[0] = (_Base_ptr)
                std::
                map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                ::end((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                       *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  __x = (value_type *)local_20;
  std::_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>::operator--
            ((_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_> *)__x,
             (int)((ulong)in_RDI._vptr_Displayable >> 0x20));
  std::_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>::operator->
            ((_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_> *)0x1f3bb0);
  mir::inst::VarId::VarId((VarId *)in_RDI._vptr_Displayable,in_stack_ffffffffffffff4c);
  std::pair<const_unsigned_int,_mir::inst::Variable>::
  pair<unsigned_int_&,_mir::inst::Variable_&,_true>
            ((pair<const_unsigned_int,_mir::inst::Variable> *)in_RDI._vptr_Displayable,
             (uint *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             (Variable *)0x1f3bec);
  std::
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  ::insert((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
            *)this,__x);
  std::pair<const_unsigned_int,_mir::inst::Variable>::~pair
            ((pair<const_unsigned_int,_mir::inst::Variable> *)0x1f3c22);
  VVar1._8_8_ = extraout_RDX;
  VVar1.super_Displayable._vptr_Displayable = in_RDI._vptr_Displayable;
  return VVar1;
}

Assistant:

mir::inst::VarId get_new_id(mir::inst::MirFunction& f, mir::inst::Variable v) {
  auto end = f.variables.end();
  end--;
  auto id = mir::inst::VarId(end->first + 1);
  f.variables.insert({id.id, v});
  return id;
}